

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash_test.cpp
# Opt level: O3

pint p_test_case_sha2_224_test(void)

{
  p_test_module_fail_counter = 0;
  p_libsys_init();
  general_hash_test(P_CRYPTO_HASH_TYPE_SHA2_224,0x1c,"abc",
                    "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",&DAT_00104080,
                    &DAT_001040a0,&DAT_001040c0,
                    "23097d223405d8228642a477bda255b32aadbce4bda0b3f7e36c9da7",
                    "75388b16512776cc5dba5da1fd890150b0c6455cb4f58b1952522525",
                    "20794655980c91d8bbb4c1ea97618a4bf03f42581948b2ee4ee7ad67",
                    "4cf3d45b57e0d54981c4d86954e8378168d5a9f6ceab9e0aae5dd2f6");
  p_libsys_shutdown();
  return -(uint)(p_test_module_fail_counter != 0);
}

Assistant:

P_TEST_CASE_BEGIN (sha2_224_test)
{
	const puchar	hash_etalon_1[] = { 35,   9, 125,  34,  52,   5, 216,  34, 134,  66,
					   164, 119, 189, 162,  85, 179,  42, 173, 188, 228,
					   189, 160, 179, 247, 227, 108, 157, 167};
	const puchar	hash_etalon_2[] = {117,  56, 139,  22,  81,  39, 118, 204,  93, 186,
					    93, 161, 253, 137,   1,  80, 176, 198,  69,  92,
					   180, 245, 139,  25,  82,  82,  37,  37};
	const puchar	hash_etalon_3[] = { 32, 121,  70,  85, 152,  12, 145, 216, 187, 180,
					   193, 234, 151,  97, 138,  75, 240,  63,  66,  88,
					    25,  72, 178, 238,  78, 231, 173, 103, };

	p_libsys_init ();

	general_hash_test (P_CRYPTO_HASH_TYPE_SHA2_224,
			   28,
			   "abc",
			   "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",
			   hash_etalon_1,
			   hash_etalon_2,
			   hash_etalon_3,
			   "23097d223405d8228642a477bda255b32aadbce4bda0b3f7e36c9da7",
			   "75388b16512776cc5dba5da1fd890150b0c6455cb4f58b1952522525",
			   "20794655980c91d8bbb4c1ea97618a4bf03f42581948b2ee4ee7ad67",
			   "4cf3d45b57e0d54981c4d86954e8378168d5a9f6ceab9e0aae5dd2f6");

	p_libsys_shutdown ();
}